

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_scalar_property
              (p_ply ply,p_ply_element_conflict element,p_ply_property_conflict property,
              p_ply_argument argument)

{
  p_ply_read_cb p_Var1;
  p_ply_ihandler p_Var2;
  int iVar3;
  p_ply_ihandler handler;
  p_ply_ihandler *driver;
  p_ply_read_cb read_cb;
  p_ply_argument argument_local;
  p_ply_property_conflict property_local;
  p_ply_element_conflict element_local;
  p_ply ply_local;
  
  p_Var1 = property->read_cb;
  p_Var2 = ply->idriver->ihandler[property->type];
  argument->length = 1;
  argument->value_index = 0;
  iVar3 = (*p_Var2)(ply,&argument->value);
  if (iVar3 == 0) {
    ply_ferror(ply,"Error reading \'%s\' of \'%s\' number %d",property,element,
               argument->instance_index);
    ply_local._4_4_ = 0;
  }
  else {
    if ((p_Var1 != (p_ply_read_cb)0x0) && (iVar3 = (*p_Var1)(argument), iVar3 == 0)) {
      ply_ferror(ply,"Aborted by user");
      return 0;
    }
    ply_local._4_4_ = 1;
  }
  return ply_local._4_4_;
}

Assistant:

static int ply_read_scalar_property(p_ply ply, p_ply_element element,
        p_ply_property property, p_ply_argument argument) {
    p_ply_read_cb read_cb = property->read_cb;
    p_ply_ihandler *driver = ply->idriver->ihandler;
    p_ply_ihandler handler = driver[property->type];
    argument->length = 1;
    argument->value_index = 0;
    if (!handler(ply, &argument->value)) {
        ply_ferror(ply, "Error reading '%s' of '%s' number %d",
                property->name, element->name, argument->instance_index);
        return 0;
    }
    if (read_cb && !read_cb(argument)) {
        ply_ferror(ply, "Aborted by user");
        return 0;
    }
    return 1;
}